

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O2

void tcu::fillWithMetaballs(PixelBufferAccess *dst,int numBalls,deUint32 seed)

{
  int iVar1;
  InternalError *this;
  int y;
  int y_00;
  int x;
  int x_00;
  ulong uVar2;
  pointer b;
  ulong uVar3;
  float fVar4;
  undefined1 extraout_XMM0 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar10 [16];
  undefined1 extraout_XMM0_00 [16];
  undefined1 auVar11 [16];
  float local_8c;
  Vector<float,_2> local_88;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> points;
  Vec2 d;
  Random rnd;
  undefined4 uStack_44;
  undefined1 auVar9 [16];
  undefined1 extraout_var [12];
  
  if ((dst->super_ConstPixelBufferAccess).m_size.m_data[2] == 1) {
    std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::vector
              (&points,(long)numBalls,(allocator_type *)&rnd);
    deRandom_init(&rnd.m_rnd,seed);
    uVar2 = 0;
    uVar3 = (ulong)(uint)numBalls;
    if (numBalls < 1) {
      uVar3 = uVar2;
    }
    auVar5 = extraout_XMM0;
    for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
      fVar4 = deRandom_getFloat(&rnd.m_rnd);
      auVar5._0_4_ = deRandom_getFloat(&rnd.m_rnd);
      auVar5._4_12_ = extraout_var;
      points.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar2].m_data[0] = fVar4;
      points.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar2].m_data[1] = auVar5._0_4_;
    }
    for (y_00 = 0; y_00 < (dst->super_ConstPixelBufferAccess).m_size.m_data[1]; y_00 = y_00 + 1) {
      auVar6._4_12_ = auVar5._4_12_;
      auVar6._0_4_ = (float)y_00;
      auVar10 = auVar6;
      for (x_00 = 0; iVar1 = (dst->super_ConstPixelBufferAccess).m_size.m_data[0], x_00 < iVar1;
          x_00 = x_00 + 1) {
        auVar7._4_12_ = auVar10._4_12_;
        auVar7._0_4_ = (float)x_00;
        uStack_44 = auVar5._4_4_;
        auVar8._12_4_ = auVar10._12_4_;
        auVar8._0_8_ = auVar7._0_8_;
        auVar8._8_4_ = auVar10._4_4_;
        auVar10._8_8_ = auVar8._8_8_;
        auVar10._4_4_ = auVar6._0_4_;
        auVar10._0_4_ = auVar7._0_4_;
        auVar9._0_12_ = auVar10._0_12_;
        auVar9._12_4_ = uStack_44;
        auVar11._0_4_ = (float)iVar1;
        auVar11._4_4_ = (float)(dst->super_ConstPixelBufferAccess).m_size.m_data[1];
        auVar11._8_8_ = 0;
        auVar10 = divps(auVar9,auVar11);
        local_88.m_data = auVar10._0_8_;
        local_8c = 0.0;
        for (b = points.
                 super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
            b != points.
                 super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish; b = b + 1) {
          operator-(&local_88,b);
          local_8c = local_8c + 0.01 / (d.m_data[0] * d.m_data[0] + d.m_data[1] * d.m_data[1]);
        }
        Vector<float,_4>::Vector((Vector<float,_4> *)&d,local_8c);
        PixelBufferAccess::setPixel(dst,(Vector<float,_4> *)&d,x_00,y_00,0);
        auVar10 = extraout_XMM0_00;
      }
      auVar5 = auVar10;
    }
    std::_Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::~_Vector_base
              (&points.
                super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>);
    return;
  }
  this = (InternalError *)__cxa_allocate_exception(0x38);
  InternalError::InternalError
            (this,(char *)0x0,"dst.getDepth() == 1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/common/tcuTextureUtil.cpp"
             ,0x3d7);
  __cxa_throw(this,&InternalError::typeinfo,Exception::~Exception);
}

Assistant:

void fillWithMetaballs (const PixelBufferAccess& dst, int numBalls, deUint32 seed)
{
	TCU_CHECK_INTERNAL(dst.getDepth() == 1);
	std::vector<Vec2>	points(numBalls);
	de::Random			rnd(seed);

	for (int i = 0; i < numBalls; i++)
	{
		float x = rnd.getFloat();
		float y = rnd.getFloat();
		points[i] = (Vec2(x, y));
	}

	for (int y = 0; y < dst.getHeight(); y++)
	for (int x = 0; x < dst.getWidth(); x++)
	{
		Vec2 p((float)x/(float)dst.getWidth(), (float)y/(float)dst.getHeight());

		float sum = 0.0f;
		for (std::vector<Vec2>::const_iterator i = points.begin(); i != points.end(); i++)
		{
			Vec2	d = p - *i;
			float	f = 0.01f / (d.x()*d.x() + d.y()*d.y());

			sum += f;
		}

		dst.setPixel(Vec4(sum), x, y);
	}
}